

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::
     format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
               (ostream *out,char *fmt,basic_string_view<char,_std::char_traits<char>_> *args,
               int *args_1,basic_string_view<char,_std::char_traits<char>_> *args_2,
               basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  ostream *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> local_78 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_78,(int *)in_RSI,in_RDI,in_stack_ffffffffffffff38);
  vformat(in_RSI,(char *)in_RDI,(FormatListRef)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}